

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

int32 __thiscall
LowererMDArch::LowerCallArgs
          (LowererMDArch *this,Instr *callInstr,ushort callFlags,ArgSlot extraParams,
          IntConstOpnd **callInfoOpndRef)

{
  StackSym *argSym;
  Instr *pIVar1;
  StackSym *this_00;
  _func_int **pp_Var2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  ArgSlot AVar7;
  ushort index;
  uint uVar8;
  undefined4 *puVar9;
  Instr *pIVar10;
  Opnd *pOVar11;
  Opnd *pOVar12;
  JITTimeFunctionBody *pJVar13;
  IntConstOpnd *this_01;
  IntConstOpnd *pIVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  if (this->helperCallArgsCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x1cb,"(this->helperCallArgsCount == 0)",
                       "We don\'t support nested helper calls yet");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  pIVar10 = IR::Instr::GetPrevRealInstr(callInstr);
  pOVar11 = IR::Instr::UnlinkSrc2(callInstr);
  OVar6 = IR::Opnd::GetKind(pOVar11);
  if (OVar6 == OpndKindSym) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar18 = 0;
    do {
      OVar6 = IR::Opnd::GetKind(pOVar11);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      argSym = (StackSym *)pOVar11[1]._vptr_Opnd;
      if ((argSym->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      if (((argSym->field_0x1a & 0x10) != 0) && (*(short *)&(argSym->super_Sym).field_0x16 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      if ((~*(uint *)&argSym->field_0x18 & 0x100001) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x1d9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                           "Arg tree not single def...");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      IR::Opnd::Free(pOVar11,this->m_func);
      pIVar1 = (argSym->field_5).m_instrDef;
      pOVar11 = IR::Instr::UnlinkSrc2(pIVar1);
      LowererMD::ChangeToAssign(pIVar1);
      pOVar12 = pIVar1->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar12);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      this_00 = (StackSym *)pOVar12[1]._vptr_Opnd;
      if ((this_00->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0064b643;
        *puVar9 = 0;
      }
      AVar7 = StackSym::GetArgSlotNum(this_00);
      if ((AVar7 == 0xffff) || (index = AVar7 + extraParams + 1, index < extraParams)) {
        Js::Throw::OutOfMemory();
      }
      pOVar12 = GetArgSlotOpnd(this,index,argSym,false);
      IR::Instr::ReplaceDst(pIVar1,pOVar12);
      pIVar10 = IR::Instr::GetPrevRealInstr(pIVar1);
      argSym->field_0x18 = argSym->field_0x18 & 199;
      IR::Instr::Unlink(pIVar1);
      IR::Instr::InsertBefore(callInstr,pIVar1);
      uVar18 = uVar18 + 1;
      OVar6 = IR::Opnd::GetKind(pOVar11);
    } while (OVar6 == OpndKindSym);
  }
  else {
    uVar18 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar11);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  pp_Var2 = pOVar11[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  if (((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  if (((ulong)pp_Var2[3] & 0x100001) != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x205,"(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  pIVar1 = (Instr *)pp_Var2[5];
  uVar16 = callInstr->m_opcode - 0xc4;
  if (((uVar16 < 0xb) && ((0x429U >> (uVar16 & 0x1f) & 1) != 0)) ||
     (callInstr->m_opcode == NewScObjectSpread)) {
    uVar18 = uVar18 + 1;
  }
  if ((pIVar1->m_opcode != StartCall) && (pIVar1->m_opcode != LoweredStartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x215,
                       "(startCallInstr->m_opcode == Js::OpCode::StartCall || startCallInstr->m_opcode == Js::OpCode::LoweredStartCall)"
                       ,"Problem with arg chain.");
    if (!bVar5) goto LAB_0064b643;
    *puVar9 = 0;
  }
  uVar8 = IR::Instr::GetArgOutCount(pIVar1,false);
  if (uVar8 != uVar18) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar5 = JITTimeFunctionBody::IsAsmJsMode(pJVar13);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x218,
                         "(startCallInstr->GetArgOutCount( false) == argCount || m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,"ArgCount doesn\'t match StartCall count");
      if (!bVar5) goto LAB_0064b643;
      *puVar9 = 0;
    }
  }
  if (callInstr->m_opcode != AsmJsCallI) {
    pFVar3 = this->m_func;
    AVar7 = Js::CallInfo::GetArgCountWithoutExtraArgs((uint)callFlags,(ArgSlot)uVar18);
    this_01 = IR::IntConstOpnd::New
                        ((ulong)((uint)callFlags << 0x18 | (uint)AVar7),TyInt32,pFVar3,true);
    if (callInfoOpndRef != (IntConstOpnd **)0x0) {
      pFVar3 = this->m_func;
      if ((this_01->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) {
LAB_0064b643:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      bVar15 = (this_01->super_Opnd).field_0xb;
      pIVar14 = this_01;
      if ((bVar15 & 2) != 0) {
        pIVar14 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar3);
        bVar15 = (pIVar14->super_Opnd).field_0xb;
      }
      (pIVar14->super_Opnd).field_0xb = bVar15 | 2;
      *callInfoOpndRef = this_01;
    }
    pOVar11 = GetArgSlotOpnd(this,extraParams + 1,(StackSym *)0x0,false);
    Lowerer::InsertMove(pOVar11,&this_01->super_Opnd,callInstr,true);
  }
  pIVar1->m_opcode = LoweredStartCall;
  uVar17 = extraParams + uVar18 + 1;
  pFVar3 = this->m_func;
  uVar16 = pFVar3->m_argSlotsForFunctionsCalled;
  if (pFVar3->m_argSlotsForFunctionsCalled <= uVar17) {
    uVar16 = uVar17;
  }
  pFVar3->m_argSlotsForFunctionsCalled = uVar16;
  pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pFVar3->m_workItem);
  bVar5 = JITTimeFunctionBody::IsAsmJsMode(pJVar13);
  if (bVar5) {
    pOVar11 = IR::Instr::UnlinkSrc1(callInstr);
    pIVar10 = IR::Instr::GetNextRealInstr(pIVar10);
    GeneratePreCall(this,callInstr,pOVar11,pIVar10);
  }
  return uVar17;
}

Assistant:

int32
LowererMDArch::LowerCallArgs(IR::Instr *callInstr, ushort callFlags, Js::ArgSlot extraParams, IR::IntConstOpnd **callInfoOpndRef /* = nullptr */)
{
    AssertMsg(this->helperCallArgsCount == 0, "We don't support nested helper calls yet");

    const Js::ArgSlot       argOffset       = 1;
    uint32                  argCount        = 0;

    // Lower args and look for StartCall

    IR::Instr * argInstr = callInstr;
    IR::Instr * cfgInsertLoc = callInstr->GetPrevRealInstr();
    IR::Opnd *src2 = argInstr->UnlinkSrc2();
    while (src2->IsSymOpnd())
    {
        IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
        StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
        AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
        argLinkOpnd->Free(this->m_func);

        argInstr = argLinkSym->m_instrDef;

        src2 = argInstr->UnlinkSrc2();
        this->lowererMD->ChangeToAssign(argInstr);

        // Mov each arg to its argSlot

        Js::ArgSlot     argPosition = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
        Js::ArgSlot     index       = argOffset + argPosition;
        if(index < argPosition)
        {
            Js::Throw::OutOfMemory();
        }
        index += extraParams;
        if(index < extraParams)
        {
            Js::Throw::OutOfMemory();
        }

        IR::Opnd *      dstOpnd     = this->GetArgSlotOpnd(index, argLinkSym);

        argInstr->ReplaceDst(dstOpnd);

        cfgInsertLoc = argInstr->GetPrevRealInstr();

        // The arg sym isn't assigned a constant directly anymore
        // TODO: We can just move the instruction down next to the call if it is just a constant assignment
        // but AMD64 doesn't have the MOV mem,imm64 encoding, and we have no code to detect if the value can fit
        // into imm32 and hoist the src if it is not.
        argLinkSym->m_isConst = false;
        argLinkSym->m_isIntConst = false;
        argLinkSym->m_isTaggableIntConst = false;

        argInstr->Unlink();
        callInstr->InsertBefore(argInstr);
        argCount++;
    }


    IR::RegOpnd *       argLinkOpnd = src2->AsRegOpnd();
    StackSym *          argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");

    IR::Instr *startCallInstr = argLinkSym->m_instrDef;

    if (callInstr->m_opcode == Js::OpCode::NewScObject ||
        callInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        callInstr->m_opcode == Js::OpCode::NewScObjectLiteral ||
        callInstr->m_opcode == Js::OpCode::NewScObjArray ||
        callInstr->m_opcode == Js::OpCode::NewScObjArraySpread)
    {
        // These push an extra arg.
        argCount++;
    }

    AssertMsg(startCallInstr->m_opcode == Js::OpCode::StartCall ||
              startCallInstr->m_opcode == Js::OpCode::LoweredStartCall,
              "Problem with arg chain.");
    AssertMsg(startCallInstr->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == argCount ||
              m_func->GetJITFunctionBody()->IsAsmJsMode(),
        "ArgCount doesn't match StartCall count");
    //
    // Machine dependent lowering
    //

    if (callInstr->m_opcode != Js::OpCode::AsmJsCallI)
    {
        // Push argCount
        IR::IntConstOpnd *argCountOpnd = Lowerer::MakeCallInfoConst(callFlags, argCount, m_func);
        if (callInfoOpndRef)
        {
            argCountOpnd->Use(m_func);
            *callInfoOpndRef = argCountOpnd;
        }
        Lowerer::InsertMove(this->GetArgSlotOpnd(1 + extraParams), argCountOpnd, callInstr);
    }
    startCallInstr = this->LowerStartCall(startCallInstr);

    const uint32 argSlots = argCount + 1 + extraParams; // + 1 for call flags
    this->m_func->m_argSlotsForFunctionsCalled = max(this->m_func->m_argSlotsForFunctionsCalled, argSlots);

    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        IR::Opnd * functionObjOpnd = callInstr->UnlinkSrc1();
        GeneratePreCall(callInstr, functionObjOpnd, cfgInsertLoc->GetNextRealInstr());
    }

    return argSlots;
}